

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O3

void __thiscall OpenMD::MagneticField::initialize(MagneticField *this)

{
  pointer pdVar1;
  double *pdVar2;
  pointer pdVar3;
  vector<double,_std::allocator<double>_> local_38;
  
  pdVar1 = (pointer)0x0;
  pdVar2 = (double *)0x0;
  pdVar3 = (pointer)0x0;
  if ((this->simParams->MagneticField).super_ParameterBase.empty_ == false) {
    this->doMagneticField = true;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_38,&(this->simParams->MagneticField).data_);
    pdVar1 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  if ((long)pdVar1 - (long)pdVar2 != 0x18) {
    snprintf(painCave.errMsg,2000,
             "MagneticField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,(long)pdVar1 - (long)pdVar2 >> 3);
    painCave.isFatal = 1;
    simError();
  }
  (this->MF).super_Vector<double,_3U>.data_[0] = *pdVar2;
  (this->MF).super_Vector<double,_3U>.data_[1] = pdVar2[1];
  (this->MF).super_Vector<double,_3U>.data_[2] = pdVar2[2];
  this->initialized = true;
  operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
  return;
}

Assistant:

void MagneticField::initialize() {
    std::vector<RealType> mf;

    if (simParams->haveMagneticField()) {
      doMagneticField = true;
      mf              = simParams->getMagneticField();
    }
    if (mf.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MagneticField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               mf.size());
      painCave.isFatal = 1;
      simError();
    }
    MF.x() = mf[0];
    MF.y() = mf[1];
    MF.z() = mf[2];

    initialized = true;
  }